

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenRefCount.cpp
# Opt level: O0

TokenRef * antlr::TokenRef::getRef(Token *p)

{
  Token *in_RDI;
  Token *pp;
  TokenRef *local_8;
  
  if (in_RDI == (Token *)0x0) {
    local_8 = (TokenRef *)0x0;
  }
  else if (in_RDI->ref == (TokenRef *)0x0) {
    local_8 = (TokenRef *)operator_new(0x10);
    TokenRef(local_8,in_RDI);
  }
  else {
    local_8 = increment(in_RDI->ref);
  }
  return local_8;
}

Assistant:

TokenRef* TokenRef::getRef(const Token* p)
{
	if (p) {
		Token* pp = const_cast<Token*>(p);
		if (pp->ref)
			return pp->ref->increment();
		else
			return new TokenRef(pp);
	} else
		return 0;
}